

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O0

ssl_hs_wait_t bssl::tls13_server_handshake(SSL_HANDSHAKE *hs)

{
  int iVar1;
  ssl_hs_wait_t local_1c;
  tls13_server_hs_state_t state;
  ssl_hs_wait_t ret;
  SSL_HANDSHAKE *hs_local;
  
  do {
    if (hs->tls13_state == 0x10) {
      return ssl_hs_ok;
    }
    local_1c = ssl_hs_error;
    iVar1 = hs->tls13_state;
    switch(iVar1) {
    case 0:
      local_1c = do_select_parameters(hs);
      break;
    case 1:
      local_1c = do_select_session(hs);
      break;
    case 2:
      local_1c = do_send_hello_retry_request(hs);
      break;
    case 3:
      local_1c = do_read_second_client_hello(hs);
      break;
    case 4:
      local_1c = do_send_server_hello(hs);
      break;
    case 5:
      local_1c = do_send_server_certificate_verify(hs);
      break;
    case 6:
      local_1c = do_send_server_finished(hs);
      break;
    case 7:
      local_1c = do_send_half_rtt_ticket(hs);
      break;
    case 8:
      local_1c = do_read_second_client_flight(hs);
      break;
    case 9:
      local_1c = do_process_end_of_early_data(hs);
      break;
    case 10:
      local_1c = do_read_client_encrypted_extensions(hs);
      break;
    case 0xb:
      local_1c = do_read_client_certificate(hs);
      break;
    case 0xc:
      local_1c = do_read_client_certificate_verify(hs);
      break;
    case 0xd:
      local_1c = do_read_channel_id(hs);
      break;
    case 0xe:
      local_1c = do_read_client_finished(hs);
      break;
    case 0xf:
      local_1c = do_send_new_session_ticket(hs);
    }
    if (hs->tls13_state != iVar1) {
      ssl_do_info_callback(hs->ssl,0x2001,1);
    }
  } while (local_1c == ssl_hs_ok);
  return local_1c;
}

Assistant:

enum ssl_hs_wait_t tls13_server_handshake(SSL_HANDSHAKE *hs) {
  while (hs->tls13_state != state13_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum tls13_server_hs_state_t state =
        static_cast<enum tls13_server_hs_state_t>(hs->tls13_state);
    switch (state) {
      case state13_select_parameters:
        ret = do_select_parameters(hs);
        break;
      case state13_select_session:
        ret = do_select_session(hs);
        break;
      case state13_send_hello_retry_request:
        ret = do_send_hello_retry_request(hs);
        break;
      case state13_read_second_client_hello:
        ret = do_read_second_client_hello(hs);
        break;
      case state13_send_server_hello:
        ret = do_send_server_hello(hs);
        break;
      case state13_send_server_certificate_verify:
        ret = do_send_server_certificate_verify(hs);
        break;
      case state13_send_server_finished:
        ret = do_send_server_finished(hs);
        break;
      case state13_send_half_rtt_ticket:
        ret = do_send_half_rtt_ticket(hs);
        break;
      case state13_read_second_client_flight:
        ret = do_read_second_client_flight(hs);
        break;
      case state13_process_end_of_early_data:
        ret = do_process_end_of_early_data(hs);
        break;
      case state13_read_client_encrypted_extensions:
        ret = do_read_client_encrypted_extensions(hs);
        break;
      case state13_read_client_certificate:
        ret = do_read_client_certificate(hs);
        break;
      case state13_read_client_certificate_verify:
        ret = do_read_client_certificate_verify(hs);
        break;
      case state13_read_channel_id:
        ret = do_read_channel_id(hs);
        break;
      case state13_read_client_finished:
        ret = do_read_client_finished(hs);
        break;
      case state13_send_new_session_ticket:
        ret = do_send_new_session_ticket(hs);
        break;
      case state13_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->tls13_state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_ACCEPT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  return ssl_hs_ok;
}